

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.cc
# Opt level: O2

ssize_t __thiscall iqxmlrpc::Parser::Impl::read(Impl *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  ssize_t sVar2;
  long lVar3;
  Parse_error *this_00;
  undefined4 in_register_00000034;
  char *__s;
  allocator<char> local_39;
  undefined1 local_38 [32];
  
  if (this->pushed_back == true) {
    this->pushed_back = false;
  }
  else if ((this->curr).is_empty == true) {
    (this->curr).element_begin = false;
    (this->curr).element_end = true;
    (this->curr).is_empty = false;
  }
  else {
    iVar1 = xmlTextReaderRead(this->reader,CONCAT44(in_register_00000034,__fd));
    (this->curr).done = true;
    if (iVar1 < 0) {
      lVar3 = xmlGetLastError();
      this_00 = (Parse_error *)__cxa_allocate_exception(0x18);
      if (lVar3 == 0) {
        __s = "unknown parsing error";
      }
      else {
        __s = *(char **)(lVar3 + 8);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)local_38,__s,&local_39);
      Parse_error::Parse_error(this_00,(string *)local_38);
      __cxa_throw(this_00,&Parse_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (iVar1 != 0) {
      iVar1 = node_type(this);
      ParseStep::ParseStep((ParseStep *)local_38,iVar1,this->reader);
      (this->curr).is_text = local_38[4];
      (this->curr).done = (bool)local_38[0];
      (this->curr).element_begin = (bool)local_38[1];
      (this->curr).element_end = (bool)local_38[2];
      (this->curr).is_empty = (bool)local_38[3];
    }
  }
  sVar2._0_1_ = (this->curr).done;
  sVar2._1_1_ = (this->curr).element_begin;
  sVar2._2_1_ = (this->curr).element_end;
  sVar2._3_1_ = (this->curr).is_empty;
  sVar2._4_1_ = (this->curr).is_text;
  sVar2._5_1_ = this->pushed_back;
  sVar2._6_2_ = *(undefined2 *)&this->field_0x2e;
  return sVar2;
}

Assistant:

ParseStep
  read()
  {
    if (pushed_back) {
      pushed_back = false;
      return curr;
    }

    if (curr.is_empty) {
      curr.element_begin = false;
      curr.element_end = true;
      curr.is_empty = false;
      return curr;
    }

    int code = xmlTextReaderRead(reader);
    curr.done = true;

    if (code < 0) {
      xmlErrorPtr err = xmlGetLastError();
      throw Parse_error(err ? err->message : "unknown parsing error");
    }

    if (code > 0) {
      curr = ParseStep(node_type(), reader);
    }

    return curr;
  }